

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O2

string * __thiscall
stackjit::toString_abi_cxx11_
          (string *__return_storage_ptr__,stackjit *this,AccessModifier *accessModifier)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (*this == (stackjit)0x1) {
    pcVar2 = "public";
    paVar1 = &local_a;
  }
  else if (*this == (stackjit)0x0) {
    pcVar2 = "private";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "";
    paVar1 = &local_b;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const AccessModifier& accessModifier) {
		switch (accessModifier) {
			case AccessModifier::Private:
				return "private";
			case AccessModifier::Public:
				return "public";
			default:
				return "";
		}
	}